

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_des3.c
# Opt level: O0

int des_ede_init_key(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  DES_key_schedule *schedule;
  const_DES_cblock *in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  DES_EDE_KEY *dat;
  DES_cblock *deskey;
  
  schedule = (DES_key_schedule *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  schedule[3].ks[0] = (_union_772)0x0;
  DES_set_key_unchecked(in_RSI,schedule);
  DES_set_key_unchecked(in_RSI + 1,schedule + 1);
  memcpy(schedule + 2,schedule,0x80);
  return 1;
}

Assistant:

static int des_ede_init_key(EVP_CIPHER_CTX *ctx, const unsigned char *key,
                            const unsigned char *iv, int enc)
{
    DES_cblock *deskey = (DES_cblock *)key;
    DES_EDE_KEY *dat = data(ctx);

    dat->stream.cbc = NULL;
# if defined(SPARC_DES_CAPABLE)
    if (SPARC_DES_CAPABLE) {
        int mode = EVP_CIPHER_CTX_get_mode(ctx);

        if (mode == EVP_CIPH_CBC_MODE) {
            des_t4_key_expand(&deskey[0], &dat->ks1);
            des_t4_key_expand(&deskey[1], &dat->ks2);
            memcpy(&dat->ks3, &dat->ks1, sizeof(dat->ks1));
            dat->stream.cbc = enc ? des_t4_ede3_cbc_encrypt :
                des_t4_ede3_cbc_decrypt;
            return 1;
        }
    }
# endif
    DES_set_key_unchecked(&deskey[0], &dat->ks1);
    DES_set_key_unchecked(&deskey[1], &dat->ks2);
    memcpy(&dat->ks3, &dat->ks1, sizeof(dat->ks1));
    return 1;
}